

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.cpp
# Opt level: O0

char * spvOperandTypeStr(spv_operand_type_t type)

{
  char *pcStack_10;
  spv_operand_type_t type_local;
  
  switch(type) {
  case SPV_OPERAND_TYPE_NONE:
    pcStack_10 = "NONE";
    break;
  case SPV_OPERAND_TYPE_ID:
  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
    pcStack_10 = "ID";
    break;
  case SPV_OPERAND_TYPE_TYPE_ID:
    pcStack_10 = "type ID";
    break;
  case SPV_OPERAND_TYPE_RESULT_ID:
    pcStack_10 = "result ID";
    break;
  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
    pcStack_10 = "memory semantics ID";
    break;
  case SPV_OPERAND_TYPE_SCOPE_ID:
    pcStack_10 = "scope ID";
    break;
  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
    pcStack_10 = "literal number";
    break;
  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
    pcStack_10 = "extension instruction number";
    break;
  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
    pcStack_10 = "OpSpecConstantOp opcode";
    break;
  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
    pcStack_10 = "possibly multi-word literal number";
    break;
  case SPV_OPERAND_TYPE_LITERAL_STRING:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
    pcStack_10 = "literal string";
    break;
  case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
    pcStack_10 = "source language";
    break;
  case SPV_OPERAND_TYPE_EXECUTION_MODEL:
    pcStack_10 = "execution model";
    break;
  case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
    pcStack_10 = "addressing model";
    break;
  case SPV_OPERAND_TYPE_MEMORY_MODEL:
    pcStack_10 = "memory model";
    break;
  case SPV_OPERAND_TYPE_EXECUTION_MODE:
    pcStack_10 = "execution mode";
    break;
  case SPV_OPERAND_TYPE_STORAGE_CLASS:
    pcStack_10 = "storage class";
    break;
  case SPV_OPERAND_TYPE_DIMENSIONALITY:
    pcStack_10 = "dimensionality";
    break;
  case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
    pcStack_10 = "sampler addressing mode";
    break;
  case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
    pcStack_10 = "sampler filter mode";
    break;
  case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
    pcStack_10 = "image format";
    break;
  case SPV_OPERAND_TYPE_IMAGE_CHANNEL_ORDER:
    pcStack_10 = "image channel order";
    break;
  case SPV_OPERAND_TYPE_IMAGE_CHANNEL_DATA_TYPE:
    pcStack_10 = "image channel data type";
    break;
  case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
    pcStack_10 = "floating-point rounding mode";
    break;
  case SPV_OPERAND_TYPE_LINKAGE_TYPE:
    pcStack_10 = "linkage type";
    break;
  case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
  case SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER:
    pcStack_10 = "access qualifier";
    break;
  case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
    pcStack_10 = "function parameter attribute";
    break;
  case SPV_OPERAND_TYPE_DECORATION:
    pcStack_10 = "decoration";
    break;
  case SPV_OPERAND_TYPE_BUILT_IN:
    pcStack_10 = "built-in";
    break;
  case SPV_OPERAND_TYPE_GROUP_OPERATION:
    pcStack_10 = "group operation";
    break;
  case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
    pcStack_10 = "kernel enqeue flags";
    break;
  case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
    pcStack_10 = "kernel profiling info";
    break;
  case SPV_OPERAND_TYPE_CAPABILITY:
    pcStack_10 = "capability";
    break;
  case SPV_OPERAND_TYPE_FPENCODING:
  case SPV_OPERAND_TYPE_OPTIONAL_FPENCODING:
    pcStack_10 = "FP encoding";
    break;
  case SPV_OPERAND_TYPE_IMAGE:
  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
    pcStack_10 = "image";
    break;
  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
    pcStack_10 = "floating-point fast math mode";
    break;
  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
    pcStack_10 = "selection control";
    break;
  case SPV_OPERAND_TYPE_LOOP_CONTROL:
    pcStack_10 = "loop control";
    break;
  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
    pcStack_10 = "function control";
    break;
  case SPV_OPERAND_TYPE_MEMORY_ACCESS:
  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
    pcStack_10 = "memory access";
    break;
  case SPV_OPERAND_TYPE_FRAGMENT_SHADING_RATE:
    pcStack_10 = "shading rate";
    break;
  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    pcStack_10 = "possibly multi-word literal integer";
    break;
  case SPV_OPERAND_TYPE_OPTIONAL_CIV:
    pcStack_10 = "context-insensitive value";
    break;
  default:
    pcStack_10 = "unknown";
    break;
  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
    pcStack_10 = "debug info flags";
    break;
  case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
    pcStack_10 = "debug base type encoding";
    break;
  case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
    pcStack_10 = "debug composite type";
    break;
  case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
    pcStack_10 = "debug type qualifier";
    break;
  case SPV_OPERAND_TYPE_DEBUG_OPERATION:
    pcStack_10 = "debug operation";
    break;
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
    pcStack_10 = "OpenCL.DebugInfo.100 debug info flags";
    break;
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
    pcStack_10 = "OpenCL.DebugInfo.100 debug base type encoding";
    break;
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
    pcStack_10 = "OpenCL.DebugInfo.100 debug composite type";
    break;
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
    pcStack_10 = "OpenCL.DebugInfo.100 debug type qualifier";
    break;
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
    pcStack_10 = "OpenCL.DebugInfo.100 debug operation";
    break;
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
    pcStack_10 = "OpenCL.DebugInfo.100 debug imported entity";
    break;
  case SPV_OPERAND_TYPE_FPDENORM_MODE:
    pcStack_10 = "FP denorm mode";
    break;
  case SPV_OPERAND_TYPE_FPOPERATION_MODE:
    pcStack_10 = "FP operation mode";
    break;
  case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
    pcStack_10 = "quantization mode";
    break;
  case SPV_OPERAND_TYPE_OVERFLOW_MODES:
    pcStack_10 = "overflow mode";
    break;
  case SPV_OPERAND_TYPE_RAY_FLAGS:
    pcStack_10 = "ray flags";
    break;
  case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
    pcStack_10 = "ray query intersection";
    break;
  case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
    pcStack_10 = "ray query committed intersection type";
    break;
  case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
    pcStack_10 = "ray query candidate intersection type";
    break;
  case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
  case SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT:
    pcStack_10 = "packed vector format";
    break;
  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
  case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
    pcStack_10 = "cooperative matrix operands";
    break;
  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_LAYOUT:
    pcStack_10 = "cooperative matrix layout";
    break;
  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_USE:
    pcStack_10 = "cooperative matrix use";
    break;
  case SPV_OPERAND_TYPE_INITIALIZATION_MODE_QUALIFIER:
    pcStack_10 = "initialization mode qualifier";
    break;
  case SPV_OPERAND_TYPE_HOST_ACCESS_QUALIFIER:
    pcStack_10 = "host access qualifier";
    break;
  case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
    pcStack_10 = "load cache control";
    break;
  case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
    pcStack_10 = "store cache control";
    break;
  case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
    pcStack_10 = "named maximum number of registers";
    break;
  case SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS:
  case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
    pcStack_10 = "raw access chain operands";
    break;
  case SPV_OPERAND_TYPE_TENSOR_CLAMP_MODE:
    pcStack_10 = "tensor clamp mode";
    break;
  case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
    pcStack_10 = "cooperative matrix reduce";
    break;
  case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
    pcStack_10 = "tensor addressing operands";
  }
  return pcStack_10;
}

Assistant:

const char* spvOperandTypeStr(spv_operand_type_t type) {
  switch (type) {
    case SPV_OPERAND_TYPE_ID:
    case SPV_OPERAND_TYPE_OPTIONAL_ID:
      return "ID";
    case SPV_OPERAND_TYPE_TYPE_ID:
      return "type ID";
    case SPV_OPERAND_TYPE_RESULT_ID:
      return "result ID";
    case SPV_OPERAND_TYPE_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
    case SPV_OPERAND_TYPE_LITERAL_FLOAT:
      return "literal number";
    case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
      return "possibly multi-word literal integer";
    case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
      return "possibly multi-word literal number";
    case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
      return "extension instruction number";
    case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
      return "OpSpecConstantOp opcode";
    case SPV_OPERAND_TYPE_LITERAL_STRING:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
      return "literal string";
    case SPV_OPERAND_TYPE_SOURCE_LANGUAGE:
      return "source language";
    case SPV_OPERAND_TYPE_EXECUTION_MODEL:
      return "execution model";
    case SPV_OPERAND_TYPE_ADDRESSING_MODEL:
      return "addressing model";
    case SPV_OPERAND_TYPE_MEMORY_MODEL:
      return "memory model";
    case SPV_OPERAND_TYPE_EXECUTION_MODE:
      return "execution mode";
    case SPV_OPERAND_TYPE_STORAGE_CLASS:
      return "storage class";
    case SPV_OPERAND_TYPE_DIMENSIONALITY:
      return "dimensionality";
    case SPV_OPERAND_TYPE_SAMPLER_ADDRESSING_MODE:
      return "sampler addressing mode";
    case SPV_OPERAND_TYPE_SAMPLER_FILTER_MODE:
      return "sampler filter mode";
    case SPV_OPERAND_TYPE_SAMPLER_IMAGE_FORMAT:
      return "image format";
    case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
      return "floating-point fast math mode";
    case SPV_OPERAND_TYPE_FP_ROUNDING_MODE:
      return "floating-point rounding mode";
    case SPV_OPERAND_TYPE_LINKAGE_TYPE:
      return "linkage type";
    case SPV_OPERAND_TYPE_ACCESS_QUALIFIER:
    case SPV_OPERAND_TYPE_OPTIONAL_ACCESS_QUALIFIER:
      return "access qualifier";
    case SPV_OPERAND_TYPE_FUNCTION_PARAMETER_ATTRIBUTE:
      return "function parameter attribute";
    case SPV_OPERAND_TYPE_DECORATION:
      return "decoration";
    case SPV_OPERAND_TYPE_BUILT_IN:
      return "built-in";
    case SPV_OPERAND_TYPE_SELECTION_CONTROL:
      return "selection control";
    case SPV_OPERAND_TYPE_LOOP_CONTROL:
      return "loop control";
    case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
      return "function control";
    case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
      return "memory semantics ID";
    case SPV_OPERAND_TYPE_MEMORY_ACCESS:
    case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
      return "memory access";
    case SPV_OPERAND_TYPE_FRAGMENT_SHADING_RATE:
      return "shading rate";
    case SPV_OPERAND_TYPE_SCOPE_ID:
      return "scope ID";
    case SPV_OPERAND_TYPE_GROUP_OPERATION:
      return "group operation";
    case SPV_OPERAND_TYPE_KERNEL_ENQ_FLAGS:
      return "kernel enqeue flags";
    case SPV_OPERAND_TYPE_KERNEL_PROFILING_INFO:
      return "kernel profiling info";
    case SPV_OPERAND_TYPE_CAPABILITY:
      return "capability";
    case SPV_OPERAND_TYPE_RAY_FLAGS:
      return "ray flags";
    case SPV_OPERAND_TYPE_RAY_QUERY_INTERSECTION:
      return "ray query intersection";
    case SPV_OPERAND_TYPE_RAY_QUERY_COMMITTED_INTERSECTION_TYPE:
      return "ray query committed intersection type";
    case SPV_OPERAND_TYPE_RAY_QUERY_CANDIDATE_INTERSECTION_TYPE:
      return "ray query candidate intersection type";
    case SPV_OPERAND_TYPE_PACKED_VECTOR_FORMAT:
    case SPV_OPERAND_TYPE_OPTIONAL_PACKED_VECTOR_FORMAT:
      return "packed vector format";
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_OPERANDS:
    case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS:
      return "cooperative matrix operands";
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_LAYOUT:
      return "cooperative matrix layout";
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_USE:
      return "cooperative matrix use";
    case SPV_OPERAND_TYPE_TENSOR_CLAMP_MODE:
      return "tensor clamp mode";
    case SPV_OPERAND_TYPE_COOPERATIVE_MATRIX_REDUCE:
      return "cooperative matrix reduce";
    case SPV_OPERAND_TYPE_TENSOR_ADDRESSING_OPERANDS:
      return "tensor addressing operands";
    case SPV_OPERAND_TYPE_INITIALIZATION_MODE_QUALIFIER:
      return "initialization mode qualifier";
    case SPV_OPERAND_TYPE_HOST_ACCESS_QUALIFIER:
      return "host access qualifier";
    case SPV_OPERAND_TYPE_LOAD_CACHE_CONTROL:
      return "load cache control";
    case SPV_OPERAND_TYPE_STORE_CACHE_CONTROL:
      return "store cache control";
    case SPV_OPERAND_TYPE_NAMED_MAXIMUM_NUMBER_OF_REGISTERS:
      return "named maximum number of registers";
    case SPV_OPERAND_TYPE_RAW_ACCESS_CHAIN_OPERANDS:
    case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
      return "raw access chain operands";
    case SPV_OPERAND_TYPE_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
      return "image";
    case SPV_OPERAND_TYPE_OPTIONAL_CIV:
      return "context-insensitive value";
    case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
      return "debug info flags";
    case SPV_OPERAND_TYPE_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
      return "debug base type encoding";
    case SPV_OPERAND_TYPE_DEBUG_COMPOSITE_TYPE:
      return "debug composite type";
    case SPV_OPERAND_TYPE_DEBUG_TYPE_QUALIFIER:
      return "debug type qualifier";
    case SPV_OPERAND_TYPE_DEBUG_OPERATION:
      return "debug operation";
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
      return "OpenCL.DebugInfo.100 debug info flags";
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_BASE_TYPE_ATTRIBUTE_ENCODING:
      return "OpenCL.DebugInfo.100 debug base type encoding";
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_COMPOSITE_TYPE:
      return "OpenCL.DebugInfo.100 debug composite type";
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_TYPE_QUALIFIER:
      return "OpenCL.DebugInfo.100 debug type qualifier";
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_OPERATION:
      return "OpenCL.DebugInfo.100 debug operation";
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_IMPORTED_ENTITY:
      return "OpenCL.DebugInfo.100 debug imported entity";
    case SPV_OPERAND_TYPE_FPENCODING:
    case SPV_OPERAND_TYPE_OPTIONAL_FPENCODING:
      return "FP encoding";

    // The next values are for values returned from an instruction, not actually
    // an operand.  So the specific strings don't matter.  But let's add them
    // for completeness and ease of testing.
    case SPV_OPERAND_TYPE_IMAGE_CHANNEL_ORDER:
      return "image channel order";
    case SPV_OPERAND_TYPE_IMAGE_CHANNEL_DATA_TYPE:
      return "image channel data type";

    case SPV_OPERAND_TYPE_FPDENORM_MODE:
      return "FP denorm mode";
    case SPV_OPERAND_TYPE_FPOPERATION_MODE:
      return "FP operation mode";
    case SPV_OPERAND_TYPE_QUANTIZATION_MODES:
      return "quantization mode";
    case SPV_OPERAND_TYPE_OVERFLOW_MODES:
      return "overflow mode";

    case SPV_OPERAND_TYPE_NONE:
      return "NONE";
    default:
      break;
  }
  return "unknown";
}